

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O3

bool __thiscall sf::priv::GlContext::setActive(GlContext *this,bool active)

{
  char cVar1;
  int iVar2;
  GlContext *pGVar3;
  undefined7 in_register_00000031;
  Lock lock;
  Lock LStack_18;
  
  pGVar3 = (GlContext *)
           ThreadLocal::getValue
                     ((ThreadLocal *)&(anonymous_namespace)::GlContextImpl::currentContext);
  if ((int)CONCAT71(in_register_00000031,active) == 0) {
    if (pGVar3 != this) {
      return true;
    }
    Lock::Lock(&LStack_18,(Mutex *)&(anonymous_namespace)::GlContextImpl::mutex);
    iVar2 = (*this->_vptr_GlContext[4])(this);
    cVar1 = (char)iVar2;
    if (cVar1 != '\0') {
      ThreadLocal::setValue
                ((ThreadLocal *)&(anonymous_namespace)::GlContextImpl::currentContext,(void *)0x0);
    }
  }
  else {
    if (pGVar3 == this) {
      return true;
    }
    Lock::Lock(&LStack_18,(Mutex *)&(anonymous_namespace)::GlContextImpl::mutex);
    iVar2 = (*this->_vptr_GlContext[4])(this,1);
    cVar1 = (char)iVar2;
    if (cVar1 != '\0') {
      ThreadLocal::setValue
                ((ThreadLocal *)&(anonymous_namespace)::GlContextImpl::currentContext,this);
    }
  }
  Lock::~Lock(&LStack_18);
  return (bool)cVar1;
}

Assistant:

bool GlContext::setActive(bool active)
{
    using GlContextImpl::mutex;
    using GlContextImpl::currentContext;
    using GlContextImpl::sharedContext;

    if (active)
    {
        if (this != currentContext)
        {
            Lock lock(mutex);

            // Activate the context
            if (makeCurrent(true))
            {
                // Set it as the new current context for this thread
                currentContext = this;
                return true;
            }
            else
            {
                return false;
            }
        }
        else
        {
            // This context is already the active one on this thread, don't do anything
            return true;
        }
    }
    else
    {
        if (this == currentContext)
        {
            Lock lock(mutex);

            // Deactivate the context
            if (makeCurrent(false))
            {
                currentContext = NULL;
                return true;
            }
            else
            {
                return false;
            }
        }
        else
        {
            // This context is not the active one on this thread, don't do anything
            return true;
        }
    }
}